

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O1

void __thiscall wasm::FunctionValidator::visitArrayGet(FunctionValidator *this,ArrayGet *curr)

{
  Type left;
  bool bVar1;
  Type local_48;
  HeapType local_40;
  int local_38;
  uintptr_t local_30;
  HeapType heapType;
  
  ValidationInfo::shouldBeTrue<wasm::ArrayGet*>
            (this->info,
             (bool)((byte)((((this->
                             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                             ).
                             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                             .
                             super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                            .currModule)->features).features >> 10) & 1),curr,
             "array.get requires gc [--enable-gc]",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  ValidationInfo::shouldBeEqualOrFirstIsUnreachable<wasm::ArrayGet*,wasm::Type>
            (this->info,(Type)(curr->index->type).id,(Type)0x2,curr,"array.get index must be an i32"
             ,(this->
              super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
              ).
              super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
              .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
              currFunction);
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)66>).super_Expression.type.id != 1) {
    left.id = (curr->ref->type).id;
    wasm::Type::Type(&local_48,(HeapType)0x6,Nullable);
    bVar1 = shouldBeSubType(this,left,local_48,(Expression *)curr,
                            "array.get target should be an array reference");
    if (bVar1) {
      local_30 = (uintptr_t)wasm::Type::getHeapType(&curr->ref->type);
      if (local_30 != 0xb) {
        bVar1 = ValidationInfo::shouldBeTrue<wasm::ArrayGet*>
                          (this->info,local_30 != 6,curr,
                           "array.get target should be a specific array reference",
                           (this->
                           super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                           ).
                           super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                           .
                           super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                           .currFunction);
        if (bVar1) {
          HeapType::getArray(&local_40);
          if ((local_40.id != 2) || (local_38 == 0)) {
            ValidationInfo::shouldBeFalse<wasm::ArrayGet*>
                      (this->info,curr->signed_,curr,"non-packed get cannot be signed",
                       (this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .currFunction);
          }
          ValidationInfo::shouldBeEqual<wasm::ArrayGet*,wasm::Type>
                    (this->info,
                     (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)66>).
                           super_Expression.type.id,(Type)local_40.id,curr,
                     "array.get must have the proper type",
                     (this->
                     super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                     ).
                     super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     .
                     super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     .currFunction);
        }
      }
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitArrayGet(ArrayGet* curr) {
  shouldBeTrue(
    getModule()->features.hasGC(), curr, "array.get requires gc [--enable-gc]");
  shouldBeEqualOrFirstIsUnreachable(
    curr->index->type, Type(Type::i32), curr, "array.get index must be an i32");
  if (curr->type == Type::unreachable) {
    return;
  }
  if (!shouldBeSubType(curr->ref->type,
                       Type(HeapType::array, Nullable),
                       curr,
                       "array.get target should be an array reference")) {
    return;
  }
  auto heapType = curr->ref->type.getHeapType();
  if (heapType == HeapType::none) {
    return;
  }
  if (!shouldBeTrue(heapType != HeapType::array,
                    curr,
                    "array.get target should be a specific array reference")) {
    return;
  }
  const auto& element = heapType.getArray().element;
  // If the type is not packed, it must be marked internally as unsigned, by
  // convention.
  if (element.type != Type::i32 || element.packedType == Field::not_packed) {
    shouldBeFalse(curr->signed_, curr, "non-packed get cannot be signed");
  }
  shouldBeEqual(
    curr->type, element.type, curr, "array.get must have the proper type");
}